

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_os_setReadHandler(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  int64_t iVar1;
  JSValueUnion JVar2;
  list_head *plVar3;
  int iVar4;
  undefined8 in_RAX;
  JSRuntime *pJVar5;
  JSThreadState *ts;
  ulong uVar6;
  JSOSRWHandler *pJVar7;
  ulong uVar8;
  JSRefCountHeader *p;
  JSValue v;
  JSValue JVar9;
  JSValue JVar10;
  int64_t iStack_40;
  int fd;
  
  fd = (int)((ulong)in_RAX >> 0x20);
  pJVar5 = JS_GetRuntime(ctx);
  ts = (JSThreadState *)JS_GetRuntimeOpaque(pJVar5);
  iVar4 = JS_ToInt32(ctx,&fd,*argv);
  iStack_40 = 6;
  if (iVar4 == 0) {
    iVar1 = argv[1].tag;
    if ((uint)iVar1 == 2) {
      pJVar7 = find_rh(ts,fd);
      iStack_40 = 3;
      iVar1 = 3;
      if (pJVar7 != (JSOSRWHandler *)0x0) {
        v.tag = pJVar7->rw_func[magic].tag;
        v.u.ptr = pJVar7->rw_func[magic].u.ptr;
        JS_FreeValue(ctx,v);
        pJVar7->rw_func[magic].u.int32 = 0;
        pJVar7->rw_func[magic].tag = 2;
        iStack_40 = iVar1;
        if (((int)pJVar7->rw_func[0].tag == 2) && ((int)pJVar7->rw_func[1].tag == 2)) {
          pJVar5 = JS_GetRuntime(ctx);
          free_rw_handler(pJVar5,pJVar7);
        }
      }
    }
    else {
      JVar2 = (JSValueUnion)argv[1].u.ptr;
      JVar10.tag = iVar1;
      JVar10.u.ptr = JVar2.ptr;
      iVar4 = JS_IsFunction(ctx,JVar10);
      if (iVar4 == 0) {
        JVar10 = JS_ThrowTypeError(ctx,"not a function");
        iStack_40 = JVar10.tag;
        uVar8 = (ulong)JVar10.u.ptr & 0xffffffff00000000;
        uVar6 = (ulong)JVar10.u._0_4_;
        goto LAB_0011084a;
      }
      pJVar7 = find_rh(ts,fd);
      if (pJVar7 == (JSOSRWHandler *)0x0) {
        pJVar7 = (JSOSRWHandler *)js_mallocz(ctx,0x38);
        if (pJVar7 == (JSOSRWHandler *)0x0) goto LAB_00110846;
        pJVar7->fd = fd;
        pJVar7->rw_func[0].u.int32 = 0;
        pJVar7->rw_func[0].tag = 2;
        pJVar7->rw_func[1].u.int32 = 0;
        pJVar7->rw_func[1].tag = 2;
        plVar3 = (ts->os_rw_handlers).prev;
        plVar3->next = (list_head *)pJVar7;
        (pJVar7->link).prev = plVar3;
        (pJVar7->link).next = (list_head *)ts;
        (ts->os_rw_handlers).prev = (list_head *)pJVar7;
      }
      JS_FreeValue(ctx,*(JSValue *)&pJVar7->rw_func[magic].u);
      if (0xfffffff4 < (uint)iVar1) {
        *(int *)JVar2.ptr = *JVar2.ptr + 1;
      }
      pJVar7->rw_func[magic].u.ptr = (void *)JVar2;
      pJVar7->rw_func[magic].tag = iVar1;
      iStack_40 = 3;
    }
  }
LAB_00110846:
  uVar6 = 0;
  uVar8 = 0;
LAB_0011084a:
  JVar9.u.ptr = (void *)(uVar6 | uVar8);
  JVar9.tag = iStack_40;
  return JVar9;
}

Assistant:

static JSValue js_os_setReadHandler(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv, int magic)
{
    JSRuntime *rt = JS_GetRuntime(ctx);
    JSThreadState *ts = JS_GetRuntimeOpaque(rt);
    JSOSRWHandler *rh;
    int fd;
    JSValueConst func;
    
    if (JS_ToInt32(ctx, &fd, argv[0]))
        return JS_EXCEPTION;
    func = argv[1];
    if (JS_IsNull(func)) {
        rh = find_rh(ts, fd);
        if (rh) {
            JS_FreeValue(ctx, rh->rw_func[magic]);
            rh->rw_func[magic] = JS_NULL;
            if (JS_IsNull(rh->rw_func[0]) &&
                JS_IsNull(rh->rw_func[1])) {
                /* remove the entry */
                free_rw_handler(JS_GetRuntime(ctx), rh);
            }
        }
    } else {
        if (!JS_IsFunction(ctx, func))
            return JS_ThrowTypeError(ctx, "not a function");
        rh = find_rh(ts, fd);
        if (!rh) {
            rh = js_mallocz(ctx, sizeof(*rh));
            if (!rh)
                return JS_EXCEPTION;
            rh->fd = fd;
            rh->rw_func[0] = JS_NULL;
            rh->rw_func[1] = JS_NULL;
            list_add_tail(&rh->link, &ts->os_rw_handlers);
        }
        JS_FreeValue(ctx, rh->rw_func[magic]);
        rh->rw_func[magic] = JS_DupValue(ctx, func);
    }
    return JS_UNDEFINED;
}